

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_upvalue * ch_loadupvalue(ch_primitive *value)

{
  ch_upvalue *pcVar1;
  undefined4 uStack_24;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_20;
  ch_upvalue *local_18;
  ch_upvalue *upvalue;
  ch_primitive *value_local;
  
  upvalue = (ch_upvalue *)value;
  pcVar1 = (ch_upvalue *)malloc(0x28);
  (pcVar1->object).type = TYPE_UPVALUE;
  pcVar1->value = (ch_primitive *)upvalue;
  pcVar1->next = (ch_upvalue *)0x0;
  local_18 = pcVar1;
  memset(&local_20,0,8);
  *(ulong *)&pcVar1->closed = CONCAT44(uStack_24,2);
  (pcVar1->closed).field_1 = local_20;
  return local_18;
}

Assistant:

ch_upvalue *ch_loadupvalue(ch_primitive* value) {
  ch_upvalue *upvalue = malloc(sizeof(ch_upvalue));
  upvalue->object.type = TYPE_UPVALUE;
  upvalue->value = value;
  upvalue->next = NULL;
  upvalue->closed = MAKE_NULL();

  return upvalue;
}